

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

IfcMatrix4 *
Assimp::IFC::ProjectOntoPlane
          (IfcMatrix4 *__return_storage_ptr__,
          vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *out_contour,
          TempMesh *in_mesh,bool *ok,IfcVector3 *nor_out)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference paVar4;
  reference v1;
  reference v2;
  double dVar5;
  undefined1 auVar6 [16];
  aiVector2t<double> aVar7;
  aiVector2t<double> local_3a8;
  ulong local_398;
  size_t i;
  aiVector3t<double> local_370;
  aiVector3t<double> *local_358;
  IfcVector3 *vv_2;
  IfcVector3 *x_1;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2_2;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> out_contour2;
  undefined1 local_298 [8];
  IfcMatrix4 mult;
  double local_208;
  double local_200;
  aiVector2t<double> local_1f8;
  aiVector2t<double> local_1e8;
  reference local_1d8;
  IfcVector2 *vv_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range2_1;
  aiVector3t<double> local_1a8;
  aiVector3t<double> local_190;
  undefined1 local_178 [8];
  IfcVector3 vv;
  IfcVector3 *x;
  const_iterator __end2;
  const_iterator __begin2;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2;
  undefined1 local_138 [8];
  IfcVector3 vmax;
  IfcVector3 vmin;
  IfcFloat zcoord;
  IfcFloat det;
  undefined1 local_b0 [8];
  IfcMatrix4 m;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *in_verts;
  IfcVector3 *nor_out_local;
  bool *ok_local;
  TempMesh *in_mesh_local;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *out_contour_local;
  
  *ok = true;
  m.d4 = (double)in_mesh;
  DerivePlaneCoordinateSpace((IfcMatrix3 *)&det,in_mesh,ok,nor_out);
  aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)local_b0,(aiMatrix3x3t<double> *)&det);
  if ((*ok & 1U) == 0) {
    aiMatrix4x4t<double>::aiMatrix4x4t(__return_storage_ptr__);
  }
  else {
    dVar5 = aiMatrix4x4t<double>::Determinant((aiMatrix4x4t<double> *)local_b0);
    if (1e-05 <= ABS(dVar5 - 1.0)) {
      __assert_fail("std::fabs(det-1) < 1e-5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                    ,0x42e,
                    "IfcMatrix4 Assimp::IFC::ProjectOntoPlane(std::vector<IfcVector2> &, const TempMesh &, bool &, IfcVector3 &)"
                   );
    }
    vmin.z = 0.0;
    sVar3 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                      ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)m.d4);
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::reserve
              (out_contour,sVar3);
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)&vmax.z);
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)local_138);
    MinMaxChooser<aiVector3t<double>_>::operator()
              ((MinMaxChooser<aiVector3t<double>_> *)((long)&__range2 + 7),
               (aiVector3t<double> *)&vmax.z,(aiVector3t<double> *)local_138);
    dVar5 = m.d4;
    __end2 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                       ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)m.d4);
    x = (IfcVector3 *)
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                  ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)dVar5);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                  *)&x);
      if (!bVar2) break;
      vv.z = (double)__gnu_cxx::
                     __normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                     ::operator*(&__end2);
      ::operator*((aiVector3t<double> *)local_178,(aiMatrix4x4t<double> *)local_b0,
                  (aiVector3t<double> *)vv.z);
      vmin.z = vv.y + vmin.z;
      std::min<double>(&local_190,(aiVector3t<double> *)local_178,(aiVector3t<double> *)&vmax.z);
      vmax.z = local_190.x;
      vmin.x = local_190.y;
      std::max<double>(&local_1a8,(aiVector3t<double> *)local_178,(aiVector3t<double> *)local_138);
      local_138 = (undefined1  [8])local_1a8.x;
      vmax.x = local_1a8.y;
      vmax.y = local_1a8.z;
      aiVector2t<double>::aiVector2t((aiVector2t<double> *)&__range2_1,(double)local_178,vv.x);
      std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                (out_contour,(value_type *)&__range2_1);
      __gnu_cxx::
      __normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
      ::operator++(&__end2);
    }
    sVar3 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                      ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)m.d4);
    auVar6._8_4_ = (int)(sVar3 >> 0x20);
    auVar6._0_8_ = sVar3;
    auVar6._12_4_ = 0x45300000;
    aiVector3t<double>::operator-=((aiVector3t<double> *)local_138,(aiVector3t<double> *)&vmax.z);
    __end2_1 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::begin
                         (out_contour);
    vv_1 = (IfcVector2 *)
           std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::end(out_contour);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                          *)&vv_1);
      if (!bVar2) break;
      paVar4 = __gnu_cxx::
               __normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
               ::operator*(&__end2_1);
      paVar4->x = (paVar4->x - vmax.z) / (double)local_138;
      paVar4->y = (paVar4->y - vmin.x) / vmax.x;
      local_1d8 = paVar4;
      aiVector2t<double>::aiVector2t(&local_1f8);
      local_1e8 = std::max<double>(paVar4,&local_1f8);
      paVar4 = local_1d8;
      local_1d8->x = local_1e8.x;
      local_1d8->y = local_1e8.y;
      aiVector2t<double>::aiVector2t((aiVector2t<double> *)&mult.d4,1.0,1.0);
      aVar7 = std::min<double>(paVar4,(aiVector2t<double> *)&mult.d4);
      local_208 = aVar7.x;
      local_1d8->x = local_208;
      local_200 = aVar7.y;
      local_1d8->y = local_200;
      __gnu_cxx::
      __normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
      ::operator++(&__end2_1);
    }
    aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)local_298);
    local_298 = (undefined1  [8])(1.0 / (double)local_138);
    mult.b1 = 1.0 / vmax.x;
    mult.a3 = -vmax.z * (double)local_298;
    mult.b3 = -vmin.x * mult.b1;
    mult.c3 = -(vmin.z / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)));
    aiMatrix4x4t<double>::operator*
              ((aiMatrix4x4t<double> *)
               &out_contour2.
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,(aiMatrix4x4t<double> *)local_298,
               (aiMatrix4x4t<double> *)local_b0);
    memcpy(local_b0,&out_contour2.
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,0x80);
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::vector
              ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)&__range2_2);
    dVar5 = m.d4;
    __end2_2 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                         ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)m.d4);
    x_1 = (IfcVector3 *)
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                    ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)dVar5);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_2,
                         (__normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                          *)&x_1);
      if (!bVar2) break;
      vv_2 = __gnu_cxx::
             __normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
             ::operator*(&__end2_2);
      ::operator*(&local_370,(aiMatrix4x4t<double> *)local_b0,vv_2);
      local_358 = &local_370;
      aiVector2t<double>::aiVector2t((aiVector2t<double> *)&i,local_370.x,local_370.y);
      std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)&__range2_2,
                 (value_type *)&i);
      if (vmax.y + 1e-08 <= ABS(local_358->z)) {
        __assert_fail("std::fabs(vv.z) < vmax.z + 1e-8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                      ,0x46a,
                      "IfcMatrix4 Assimp::IFC::ProjectOntoPlane(std::vector<IfcVector2> &, const TempMesh &, bool &, IfcVector3 &)"
                     );
      }
      __gnu_cxx::
      __normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
      ::operator++(&__end2_2);
    }
    local_398 = 0;
    while( true ) {
      uVar1 = local_398;
      sVar3 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size
                        (out_contour);
      if (sVar3 <= uVar1) break;
      v1 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::operator[]
                     (out_contour,local_398);
      v2 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::operator[]
                     ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                      &__range2_2,local_398);
      aVar7 = ::operator-(v1,v2);
      local_3a8 = aVar7;
      dVar5 = aiVector2t<double>::SquareLength(&local_3a8);
      if (1e-06 <= dVar5) {
        __assert_fail("(out_contour[i]-out_contour2[i]).SquareLength() < 1e-6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                      ,0x46e,
                      "IfcMatrix4 Assimp::IFC::ProjectOntoPlane(std::vector<IfcVector2> &, const TempMesh &, bool &, IfcVector3 &)"
                     );
      }
      local_398 = local_398 + 1;
    }
    memcpy(__return_storage_ptr__,local_b0,0x80);
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::~vector
              ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)&__range2_2);
  }
  return __return_storage_ptr__;
}

Assistant:

IfcMatrix4 ProjectOntoPlane(std::vector<IfcVector2>& out_contour, const TempMesh& in_mesh,
    bool &ok, IfcVector3& nor_out)
{
    const std::vector<IfcVector3>& in_verts = in_mesh.mVerts;
    ok = true;

    IfcMatrix4 m = IfcMatrix4(DerivePlaneCoordinateSpace(in_mesh, ok, nor_out));
    if(!ok) {
        return IfcMatrix4();
    }
#ifdef ASSIMP_BUILD_DEBUG
    const IfcFloat det = m.Determinant();
    ai_assert(std::fabs(det-1) < 1e-5);
#endif

    IfcFloat zcoord = 0;
    out_contour.reserve(in_verts.size());


    IfcVector3 vmin, vmax;
    MinMaxChooser<IfcVector3>()(vmin, vmax);

    // Project all points into the new coordinate system, collect min/max verts on the way
    for(const IfcVector3& x : in_verts) {
        const IfcVector3 vv = m * x;
        // keep Z offset in the plane coordinate system. Ignoring precision issues
        // (which  are present, of course), this should be the same value for
        // all polygon vertices (assuming the polygon is planar).

        // XXX this should be guarded, but we somehow need to pick a suitable
        // epsilon
        // if(coord != -1.0f) {
        //  assert(std::fabs(coord - vv.z) < 1e-3f);
        // }
        zcoord += vv.z;
        vmin = std::min(vv, vmin);
        vmax = std::max(vv, vmax);

        out_contour.push_back(IfcVector2(vv.x,vv.y));
    }

    zcoord /= in_verts.size();

    // Further improve the projection by mapping the entire working set into
    // [0,1] range. This gives us a consistent data range so all epsilons
    // used below can be constants.
    vmax -= vmin;
    for(IfcVector2& vv : out_contour) {
        vv.x  = (vv.x - vmin.x) / vmax.x;
        vv.y  = (vv.y - vmin.y) / vmax.y;

        // sanity rounding
        vv = std::max(vv,IfcVector2());
        vv = std::min(vv,one_vec);
    }

    IfcMatrix4 mult;
    mult.a1 = static_cast<IfcFloat>(1.0) / vmax.x;
    mult.b2 = static_cast<IfcFloat>(1.0) / vmax.y;

    mult.a4 = -vmin.x * mult.a1;
    mult.b4 = -vmin.y * mult.b2;
    mult.c4 = -zcoord;
    m = mult * m;

    // debug code to verify correctness
#ifdef ASSIMP_BUILD_DEBUG
    std::vector<IfcVector2> out_contour2;
    for(const IfcVector3& x : in_verts) {
        const IfcVector3& vv = m * x;

        out_contour2.push_back(IfcVector2(vv.x,vv.y));
        ai_assert(std::fabs(vv.z) < vmax.z + 1e-8);
    }

    for(size_t i = 0; i < out_contour.size(); ++i) {
        ai_assert((out_contour[i]-out_contour2[i]).SquareLength() < 1e-6);
    }
#endif

    return m;
}